

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O1

int do_makedir(char *path)

{
  __mode_t __mode;
  __mode_t __mask;
  int iVar1;
  uint uVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  char *__s_00;
  bool bVar5;
  bool bVar6;
  undefined1 local_d0 [8];
  stat sb;
  
  __s = adjustname(path,1);
  if (__s != (char *)0x0) {
    sVar3 = strlen(__s);
    pcVar4 = __s + sVar3;
    while ((pcVar4 = pcVar4 + -1, __s < pcVar4 && (*pcVar4 == '/'))) {
      *pcVar4 = '\0';
    }
    __mask = umask(0);
    sVar3 = strspn(__s,"/");
    pcVar4 = __s + sVar3;
    sVar3 = strcspn(pcVar4,"/");
    bVar5 = pcVar4[sVar3] == '\0';
    pcVar4[sVar3] = '\0';
    iVar1 = stat(__s,(stat *)local_d0);
    bVar6 = iVar1 == 0;
    if (!bVar5 || !bVar6) {
      sb.__glibc_reserved[2]._4_4_ = ~__mask & 0x1ff;
      uVar2 = sb.__glibc_reserved[2]._4_4_ | 0xc0;
      pcVar4 = pcVar4 + sVar3;
      do {
        if (((!bVar6) || (bVar5)) || (((uint)sb.st_nlink & 0xf000) != 0x4000)) {
          __mode = uVar2;
          if (bVar5) {
            __mode = sb.__glibc_reserved[2]._4_4_;
          }
          iVar1 = mkdir(__s,__mode);
          if (iVar1 != 0) {
            if (!bVar6) {
              dobeep();
              ewprintf("Creating directory: permission denied, %s",__s);
LAB_0010a311:
              umask(__mask);
              return 0;
            }
            if (((uint)sb.st_nlink & 0xf000) != 0x4000) {
              eerase();
              goto LAB_0010a311;
            }
          }
          if (bVar5) {
            eerase();
            umask(__mask);
            return 1;
          }
        }
        *pcVar4 = '/';
        sVar3 = strspn(pcVar4,"/");
        __s_00 = pcVar4 + sVar3;
        sVar3 = strcspn(__s_00,"/");
        pcVar4 = __s_00 + sVar3;
        bVar5 = __s_00[sVar3] == '\0';
        __s_00[sVar3] = '\0';
        iVar1 = stat(__s,(stat *)local_d0);
        bVar6 = iVar1 == 0;
      } while (!bVar5 || !bVar6);
    }
    dobeep();
    ewprintf("Cannot create directory %s: file exists",__s);
  }
  return 0;
}

Assistant:

int
do_makedir(char *path)
{
	struct stat	 sb;
	int		 finished, ishere;
	mode_t		 dir_mode, f_mode, oumask;
	char		*slash;

	if ((path = adjustname(path, TRUE)) == NULL)
		return (FALSE);

	/* Remove trailing slashes */
	slash = strrchr(path, '\0');
	while (--slash > path && *slash == '/')
		*slash = '\0';

	slash = path;

	oumask = umask(0);
	f_mode = 0777 & ~oumask;
	dir_mode = f_mode | S_IWUSR | S_IXUSR;

	for (;;) {
		slash += strspn(slash, "/");
		slash += strcspn(slash, "/");

		finished = (*slash == '\0');
		*slash = '\0';

		ishere = !stat(path, &sb);
		if (finished && ishere) {
			dobeep();
			ewprintf("Cannot create directory %s: file exists",
			     path);
			return(FALSE);
		} else if (!finished && ishere && S_ISDIR(sb.st_mode)) {
			*slash = '/';
			continue;
		}

		if (mkdir(path, finished ? f_mode : dir_mode) == 0) {
			if (f_mode > 0777 && chmod(path, f_mode) == -1) {
				umask(oumask);
				return (ABORT);
			}
		} else {
			if (!ishere || !S_ISDIR(sb.st_mode)) {
				if (!ishere) {
					dobeep();
					ewprintf("Creating directory: "
					    "permission denied, %s", path);
				} else
					eerase();

				umask(oumask);
				return (FALSE);
			}
		}

		if (finished)
			break;

		*slash = '/';
	}

	eerase();
	umask(oumask);
	return (TRUE);
}